

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O2

textblock * effect_describe(effect *e,char *prefix,int dev_skill_boost,_Bool only_first)

{
  ushort uVar1;
  ushort uVar2;
  wchar_t wVar3;
  dice_t *dice;
  random_value value_00;
  bool bVar4;
  byte bVar5;
  uint16_t uVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  textblock *ptVar11;
  textblock *tb;
  textblock *tb_00;
  char *pcVar12;
  effect *effect;
  int iVar13;
  effect *effect_00;
  random_value *prVar14;
  byte bVar15;
  int iVar16;
  byte bVar17;
  random_value value_01;
  int local_310;
  random_value value;
  int local_2d4;
  random_value first_rv;
  char dice_string [20];
  char desc [250];
  random_value this_rv;
  char dice_string_1 [20];
  
  value.base = 0;
  value.dice = 0;
  value.sides = 0;
  value.m_bonus = 0;
  bVar4 = false;
  local_2d4 = 0;
  tb_00 = (textblock *)0x0;
LAB_001401e7:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if (e == (effect *)0x0) {
            return tb_00;
          }
          pcVar8 = effect_desc(e);
          uVar6 = e->index;
          if (uVar6 != 0x6d) break;
          if (e->dice == (dice_t *)0x0) {
            __assert_fail("e->dice != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                          ,0x157,
                          "textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
                         );
          }
          dice_roll(e->dice,&value);
          e = e->next;
          bVar4 = true;
        }
        if (uVar6 != 0x6e) break;
        if (!bVar4) {
          __assert_fail("value_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                        ,0x14f,
                        "textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
                       );
        }
        e = e->next;
        bVar4 = false;
      }
      local_310 = 0;
      if ((e->dice != (dice_t *)0x0) && (!bVar4)) {
        local_310 = dice_roll(e->dice,&value);
        uVar6 = e->index;
      }
      if ((uVar6 != 0x6c) && (uVar6 != 1)) break;
      e = e->next;
      pcVar8 = (char *)0x0;
      if (local_2d4 == 0) {
        pcVar8 = prefix;
      }
      pcVar12 = (char *)0x0;
      if (uVar6 == 1) {
        pcVar12 = "randomly ";
      }
      first_rv.base = 0;
      first_rv.dice = 0;
      first_rv.sides = 0;
      first_rv.m_bonus = 0;
      iVar16 = 1;
      while( true ) {
        if ((e == (effect *)0x0) || (local_310 <= iVar16 + -1)) goto LAB_00140319;
        pcVar9 = effect_desc(e);
        if ((pcVar9 != (char *)0x0) && ((uVar1 = e->index, uVar1 != 0x6c && (uVar1 != 1)))) break;
        e = e->next;
        iVar16 = iVar16 + 1;
      }
      wVar3 = e->other;
      dice = e->dice;
      if (dice != (dice_t *)0x0) {
        dice_random_value(dice,&first_rv);
      }
      bVar17 = 1;
      bVar15 = 1;
      bVar5 = 1;
      iVar13 = 1;
      effect = e;
      for (iVar7 = iVar16; (effect = effect->next, effect != (effect *)0x0 && (iVar7 < local_310));
          iVar7 = iVar7 + 1) {
        pcVar9 = effect_desc(effect);
        if (((pcVar9 != (char *)0x0) && (uVar2 = effect->index, uVar2 != 1)) && (uVar2 != 0x6c)) {
          iVar13 = iVar13 + 1;
          bVar17 = uVar2 == uVar1 & bVar17;
          bVar15 = effect->other == wVar3 & bVar15;
          if (effect->dice == (dice_t *)0x0) {
            bVar5 = dice == (dice_t *)0x0 & bVar5;
          }
          else if (dice == (dice_t *)0x0) {
            bVar5 = 0;
          }
          else {
            dice_random_value(effect->dice,&this_rv);
            if (((this_rv.base != first_rv.base) || (this_rv.dice != first_rv.dice)) ||
               ((this_rv.sides != first_rv.sides || (this_rv.m_bonus != first_rv.m_bonus)))) {
              bVar5 = 0;
            }
          }
        }
      }
      if ((bool)(bVar17 & bVar5 & bVar15 & (uVar1 & 0xfffe) == 0x48)) {
        strnfmt(dice_string,0x78,"%s",projections[e->subtype].player_desc);
        pcVar12 = " or ";
        if (2 < iVar13) {
          pcVar12 = ", or ";
        }
        iVar7 = 1;
        pcVar9 = pcVar12;
        effect_00 = e;
        for (; (effect_00 = effect_00->next, effect_00 != (effect *)0x0 && (iVar16 < local_310));
            iVar16 = iVar16 + 1) {
          pcVar10 = effect_desc(effect_00);
          if ((pcVar10 != (char *)0x0) && ((effect_00->index != 1 && (effect_00->index != 0x6c)))) {
            pcVar9 = ", ";
            if (iVar7 == iVar13 + -1) {
              pcVar9 = pcVar12;
            }
            my_strcat(dice_string,pcVar9,0x78);
            pcVar9 = (char *)((long)effect_00->subtype * 0x68);
            my_strcat(dice_string,projections[effect_00->subtype].player_desc,0x78);
            iVar7 = iVar7 + 1;
          }
        }
        format_dice_string(&first_rv,1,(size_t)dice_string_1,pcVar9);
        pcVar12 = effect_desc(e);
        strnfmt((char *)&this_rv,200,pcVar12,dice_string,(ulong)(uint)e->other,dice_string_1);
        iVar16 = dev_skill_boost;
        if (e->index == 0x48) {
          iVar16 = 0;
        }
        value_00.dice = first_rv.dice;
        value_00.base = first_rv.base;
        value_00.sides = first_rv.sides;
        value_00.m_bonus = first_rv.m_bonus;
        append_damage((char *)&this_rv,200,value_00,iVar16);
        tb = textblock_new();
        if (pcVar8 != (char *)0x0) {
          textblock_append(tb,"%s");
        }
        if (uVar6 == 1) {
          textblock_append(tb,"%s","randomly ");
        }
        copy_to_textblock_with_coloring(tb,(char *)&this_rv);
      }
      else {
        ptVar11 = effect_describe(e,pcVar12,dev_skill_boost,true);
        if (ptVar11 == (textblock *)0x0) {
          iVar13 = iVar13 + -1;
          tb = (textblock *)0x0;
          iVar7 = 0;
        }
        else {
          tb = ptVar11;
          if (pcVar8 != (char *)0x0) {
            tb = textblock_new();
            textblock_append(tb,"%s",pcVar8);
            textblock_append_textblock(tb,ptVar11);
            textblock_free(ptVar11);
          }
          iVar7 = 1;
        }
        for (; (e = e->next, e != (effect *)0x0 && (iVar16 < local_310)); iVar16 = iVar16 + 1) {
          pcVar9 = effect_desc(e);
          if ((pcVar9 != (char *)0x0) && ((e->index != 1 && (e->index != 0x6c)))) {
            pcVar9 = (char *)0x0;
            if (iVar7 == 0) {
              pcVar9 = pcVar12;
            }
            ptVar11 = effect_describe(e,pcVar9,dev_skill_boost,true);
            if (ptVar11 == (textblock *)0x0) {
              iVar13 = iVar13 + -1;
            }
            else {
              if ((pcVar8 == (char *)0x0) || (tb != (textblock *)0x0)) {
                if (tb != (textblock *)0x0) {
                  if (0 < iVar7) {
                    pcVar9 = ", ";
                    if (iVar7 == iVar13 + -1) {
                      pcVar9 = " or ";
                    }
                    textblock_append(tb,pcVar9);
                  }
                  goto LAB_00140894;
                }
              }
              else {
                if (iVar7 != 0) {
                  __assert_fail("ivalid == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                                ,0x11e,
                                "textblock *create_nested_effect_description(const struct effect *, int, const char *, const char *, int, const struct effect **)"
                               );
                }
                tb = textblock_new();
                textblock_append(tb,"%s",pcVar8);
                if (tb != (textblock *)0x0) {
LAB_00140894:
                  textblock_append_textblock(tb,ptVar11);
                  textblock_free(ptVar11);
                  ptVar11 = tb;
                }
              }
              iVar7 = iVar7 + 1;
              tb = ptVar11;
            }
          }
        }
      }
      e = effect;
      if (only_first) {
        e = (effect *)0x0;
      }
      if (tb != (textblock *)0x0) {
        if (tb_00 != (textblock *)0x0) {
          pcVar8 = ", ";
          if (e == (effect *)0x0) {
            pcVar8 = " and ";
          }
          textblock_append(tb_00,pcVar8);
          textblock_append_textblock(tb_00,tb);
          textblock_free(tb);
          tb = tb_00;
        }
        local_2d4 = local_2d4 + 1;
        tb_00 = tb;
      }
    }
    if (pcVar8 == (char *)0x0) {
      if (only_first) {
        e = (effect *)0x0;
      }
      else {
        e = e->next;
      }
      goto LAB_001401e7;
    }
    format_dice_string(&value,1,(size_t)dice_string,(char *)e);
    iVar16 = dev_skill_boost;
    switch(base_descs[e->index].efinfo_flag) {
    case 0:
      pcVar8 = "%s";
      goto LAB_00140c7b;
    case 1:
      goto LAB_00140c7b;
    case 2:
      if (value.m_bonus == 0) {
        strnfmt((char *)&this_rv,0x32,"%s","");
      }
      else {
        strnfmt((char *)&this_rv,0x32," (or %d%%, whichever is greater)");
      }
      pcVar12 = dice_string;
      goto LAB_00140d89;
    case 3:
      goto LAB_00140c18;
    case 4:
      pcVar12 = "leaves you nourished";
      if (e->subtype == L'\x01') {
        pcVar12 = "uses enough food value";
      }
      if (e->subtype == L'\0') {
        pcVar12 = "feeds you";
      }
      format_dice_string(&value,(uint)z_info->food_value,(size_t)&this_rv,"uses enough food value");
      strnfmt(desc,0xfa,pcVar8,pcVar12,&this_rv,dice_string);
      break;
    case 5:
      goto LAB_00140c7b;
    case 6:
      pcVar12 = timed_effects[e->subtype].desc;
      prVar14 = (random_value *)dice_string;
      goto LAB_00140d8c;
    case 7:
      lookup_obj_property(1,e->subtype);
      goto LAB_00140c7b;
    case 8:
    case 0x11:
    case 0x13:
      goto LAB_00140c7b;
    case 9:
      summon_desc(e->subtype);
LAB_00140c7b:
      strnfmt(desc,0xfa,pcVar8);
      break;
    case 10:
      if (value.m_bonus == 0) {
        strnfmt((char *)&this_rv,0x20,"%d grids",value._0_8_ & 0xffffffff);
      }
      else {
        strnfmt((char *)&this_rv,0x20,"a level-dependent distance");
      }
      pcVar12 = "a monster";
      if (e->subtype == L'\0') {
        pcVar12 = "you";
      }
LAB_00140d89:
      prVar14 = &this_rv;
LAB_00140d8c:
      strnfmt(desc,0xfa,pcVar8,pcVar12,prVar14);
      break;
    case 0xb:
LAB_00140c18:
      strnfmt(desc,0xfa,pcVar8);
      break;
    case 0xc:
      strnfmt(desc,0xfa,pcVar8,projections[e->subtype].player_desc,(ulong)(uint)e->radius,
              dice_string);
      goto LAB_00140d08;
    case 0xd:
      wVar3 = e->other;
      if (e->other == L'\0') {
        wVar3 = e->radius;
      }
      strnfmt(desc,0xfa,pcVar8,projections[e->subtype].player_desc,(ulong)(uint)e->radius,
              (ulong)(uint)wVar3,dice_string);
      goto LAB_00140d08;
    case 0xe:
      strnfmt(desc,0xfa,pcVar8,projections[e->subtype].player_desc,(ulong)(uint)e->other,dice_string
             );
      if (e->index == 0x48) {
        iVar16 = 0;
      }
      goto LAB_00140d08;
    case 0xf:
      if (e->other == L'\0') {
        iVar16 = 0;
      }
      else {
        iVar16 = (int)player->lev / e->other;
      }
      strnfmt(desc,0xfa,pcVar8,projections[e->subtype].player_desc,(ulong)(uint)(iVar16 + e->radius)
              ,dice_string);
      break;
    case 0x10:
      strnfmt(desc,0xfa,pcVar8);
      break;
    case 0x12:
      strnfmt(desc,0xfa,pcVar8,projections[e->subtype].desc,dice_string);
LAB_00140d08:
      value_01.sides = value.sides;
      value_01.m_bonus = value.m_bonus;
      value_01.base = value.base;
      value_01.dice = value.dice;
      append_damage(desc,0xfa,value_01,iVar16);
      break;
    default:
      strnfmt(desc,0xfa,"%s");
      msg("Bad effect description passed to effect_info().  Please report this bug.");
    }
    if (only_first) {
      e = (effect *)0x0;
    }
    else {
      e = e->next;
    }
    if (desc[0] != '\0') {
      if (tb_00 == (textblock *)0x0) {
        tb_00 = textblock_new();
        if (prefix != (char *)0x0) {
          textblock_append(tb_00,"%s",prefix);
        }
      }
      else {
        if (e == (effect *)0x0) {
          pcVar8 = " and ";
        }
        else {
          pcVar8 = ", ";
        }
        textblock_append(tb_00,pcVar8);
      }
      copy_to_textblock_with_coloring(tb_00,desc);
      local_2d4 = local_2d4 + 1;
    }
  } while( true );
LAB_00140319:
  if (only_first) {
    e = (effect *)0x0;
  }
  goto LAB_001401e7;
}

Assistant:

textblock *effect_describe(const struct effect *e, const char *prefix,
	int dev_skill_boost, bool only_first)
{
	textblock *tb = NULL;
	int nadded = 0;
	char desc[250];
	random_value value = { 0, 0, 0, 0 };
	bool value_set = false;

	while (e) {
		const char* edesc = effect_desc(e);
		int roll = 0;
		char dice_string[20];

		/* Deal with special clear value effect. */
		if (e->index == EF_CLEAR_VALUE) {
			assert(value_set);
			value_set = false;
			e = e->next;
			continue;
		}

		/* Deal with special set value effect. */
		if (e->index == EF_SET_VALUE) {
			assert(e->dice != NULL);
			roll = dice_roll(e->dice, &value);
			value_set = true;
			e = e->next;
			continue;
		}

		if ((e->dice != NULL) && !value_set) {
			roll = dice_roll(e->dice, &value);
		}

		/* Deal with special random or select effects. */
		if (e->index == EF_RANDOM || e->index == EF_SELECT) {
			const struct effect *nexte;
			textblock *tbe = create_nested_effect_description(
				e->next, roll, (nadded == 0) ? prefix : NULL,
				(e->index == EF_RANDOM) ? "randomly " : NULL,
				dev_skill_boost, &nexte);

			e = (only_first) ? NULL : nexte;
			if (tbe) {
				if (tb) {
					textblock_append(tb,
						e ? ", " : " and ");
					textblock_append_textblock(tb, tbe);
					textblock_free(tbe);
				} else {
					tb = tbe;
				}
				++nadded;
			}
			continue;
		}

		if (!edesc) {
			e = (only_first) ? NULL : e->next;
			continue;
		}

		format_dice_string(&value, 1, sizeof(dice_string), dice_string);

		/* Check all the possible types of description format. */
		switch (base_descs[e->index].efinfo_flag) {
		case EFINFO_DICE:
			strnfmt(desc, sizeof(desc), edesc, dice_string);
			break;

		case EFINFO_HEAL:
			/* Healing sometimes has a minimum percentage. */
			{
				char min_string[50];

				if (value.m_bonus) {
					strnfmt(min_string, sizeof(min_string),
						" (or %d%%, whichever is greater)",
						value.m_bonus);
				} else {
					strnfmt(min_string, sizeof(min_string),
						"%s", "");
				}
				strnfmt(desc, sizeof(desc), edesc, dice_string,
					min_string);
			}
			break;

		case EFINFO_CONST:
			strnfmt(desc, sizeof(desc), edesc, value.base / 2);
			break;

		case EFINFO_FOOD:
			{
				const char *fed = e->subtype ?
					(e->subtype == 1 ? "uses enough food value" : 
					 "leaves you nourished") : "feeds you";
				char turn_dice_string[20];

				format_dice_string(&value, z_info->food_value,
					sizeof(turn_dice_string),
					turn_dice_string);

				strnfmt(desc, sizeof(desc), edesc, fed,
					turn_dice_string, dice_string);
			}
			break;

		case EFINFO_CURE:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc);
			break;

		case EFINFO_TIMED:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc,
				dice_string);
			break;

		case EFINFO_STAT:
			{
				int stat = e->subtype;

				strnfmt(desc, sizeof(desc), edesc,
					lookup_obj_property(OBJ_PROPERTY_STAT, stat)->name);
			}
			break;

		case EFINFO_SEEN:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_SUMM:
			strnfmt(desc, sizeof(desc), edesc,
				summon_desc(e->subtype));
			break;

		case EFINFO_TELE:
			/*
			 * Only currently used for the player, but can handle
			 * monsters.
			 */
			{
				char dist[32];

				if (value.m_bonus) {
					strnfmt(dist, sizeof(dist),
						"a level-dependent distance");
				} else {
					strnfmt(dist, sizeof(dist),
						"%d grids", value.base);
				}
				strnfmt(desc, sizeof(desc), edesc,
					(e->subtype) ? "a monster" : "you",
					dist);
			}
			break;

		case EFINFO_QUAKE:
			strnfmt(desc, sizeof(desc), edesc, e->radius);
			break;

		case EFINFO_BALL:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_SPOT:
			{
				int i_radius = e->other ? e->other : e->radius;

				strnfmt(desc, sizeof(desc), edesc,
					projections[e->subtype].player_desc,
					e->radius, i_radius, dice_string);
				append_damage(desc, sizeof(desc), value, dev_skill_boost);
			}
			break;

		case EFINFO_BREATH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc, e->other,
				dice_string);
			append_damage(desc, sizeof(desc), value,
				e->index == EF_BREATH ? 0 : dev_skill_boost);
			break;

		case EFINFO_SHORT:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius +
					(e->other ? player->lev / e->other : 0),
				dice_string);
			break;

		case EFINFO_LASH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].lash_desc, e->subtype);
			break;

		case EFINFO_BOLT:
			/* Bolt that inflict status */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_BOLTD:
			/* Bolts and beams that damage */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_TOUCH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_NONE:
			strnfmt(desc, sizeof(desc), "%s", edesc);
			break;

		default:
			strnfmt(desc, sizeof(desc), "%s", "");
			msg("Bad effect description passed to effect_info().  Please report this bug.");
			break;
		}

		e = (only_first) ? NULL : e->next;

		if (desc[0] != '\0') {
			if (tb) {
				if (e) {
					textblock_append(tb, ", ");
				} else {
					textblock_append(tb, " and ");
				}
			} else {
				tb = textblock_new();
				if (prefix) {
					textblock_append(tb, "%s", prefix);
				}
			}
			copy_to_textblock_with_coloring(tb, desc);

			++nadded;
		}
	}

	return tb;
}